

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrShaders.cpp
# Opt level: O3

void __thiscall
rr::GeometryShader::GeometryShader
          (GeometryShader *this,size_t numVaryingInputs,size_t numVaryingOutputs,
          GeometryShaderInputType inputType,GeometryShaderOutputType outputType,size_t verticesOut,
          size_t numInvocations)

{
  allocator_type local_1a;
  allocator_type local_19;
  
  this->_vptr_GeometryShader = (_func_int **)&PTR___cxa_pure_virtual_00d2ef40;
  this->m_inputType = inputType;
  this->m_outputType = outputType;
  this->m_numVerticesOut = verticesOut;
  this->m_numInvocations = numInvocations;
  std::vector<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>::vector
            (&this->m_inputs,numVaryingInputs,&local_19);
  std::vector<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>::vector
            (&this->m_outputs,numVaryingOutputs,&local_1a);
  return;
}

Assistant:

GeometryShader::GeometryShader (size_t numVaryingInputs, size_t numVaryingOutputs, GeometryShaderInputType inputType, GeometryShaderOutputType outputType, size_t verticesOut, size_t numInvocations)
	: m_inputType		(inputType)
	, m_outputType		(outputType)
	, m_numVerticesOut	(verticesOut)
	, m_numInvocations	(numInvocations)
	, m_inputs			(numVaryingInputs)
	, m_outputs			(numVaryingOutputs)
{
}